

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getGyrationalVolume(Thermo *this)

{
  int iVar1;
  SnapshotManager *this_00;
  undefined8 *in_RDI;
  double dVar2;
  double dVar3;
  RealType RVar4;
  RealType volume;
  RealType geomCnst;
  RealType sysconstants;
  Vector3d dummyAngMom;
  RealType det;
  Mat3x3d intTensor;
  Snapshot *snap;
  Vector3d *in_stack_000004e0;
  Mat3x3d *in_stack_000004e8;
  Thermo *in_stack_000004f0;
  SquareMatrix3<double> local_58;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_10->hasGyrationalVolume & 1U) == 0) {
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1b1cf3);
    Vector3<double>::Vector3((Vector3<double> *)0x1b1cfd);
    getInertiaTensor(in_stack_000004f0,in_stack_000004e8,in_stack_000004e0);
    dVar2 = SquareMatrix3<double>::determinant(&local_58);
    iVar1 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)*in_RDI);
    dVar3 = pow(1.5 / (double)iVar1,1.5);
    dVar2 = sqrt(dVar2);
    Snapshot::setGyrationalVolume(local_10,dVar3 * 4.1887902047863905 * dVar2);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1b1dd7);
  }
  RVar4 = Snapshot::getGyrationalVolume(local_10);
  return RVar4;
}

Assistant:

RealType Thermo::getGyrationalVolume() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasGyrationalVolume) {
      Mat3x3d intTensor;
      RealType det;
      Vector3d dummyAngMom;
      RealType sysconstants;
      RealType geomCnst;
      RealType volume;

      geomCnst = 3.0 / 2.0;
      /* Get the inertial tensor and angular momentum for free*/
      getInertiaTensor(intTensor, dummyAngMom);

      det = intTensor.determinant();
      sysconstants =
          geomCnst / (RealType)(info_->getNGlobalIntegrableObjects());
      volume =
          4.0 / 3.0 * Constants::PI * pow(sysconstants, geomCnst) * sqrt(det);

      snap->setGyrationalVolume(volume);
    }
    return snap->getGyrationalVolume();
  }